

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O2

_Bool ecs_get_info(ecs_world_t *world,ecs_entity_t entity,ecs_entity_info_t *info)

{
  ecs_entity_info_t *info_00;
  ecs_record_t *record;
  
  info->is_watched = false;
  info->data = (ecs_data_t *)0x0;
  info->record = (ecs_record_t *)0x0;
  info->table = (ecs_table_t *)0x0;
  if ((-1 < (long)entity) &&
     (info_00 = (ecs_entity_info_t *)_ecs_sparse_get_sparse((world->store).entity_index,0x10,entity)
     , info_00 != (ecs_entity_info_t *)0x0)) {
    set_info_from_record((ecs_entity_t)info,info_00,record);
    return true;
  }
  return false;
}

Assistant:

bool ecs_get_info(
    ecs_world_t * world,
    ecs_entity_t entity,
    ecs_entity_info_t * info)
{
    info->table = NULL;
    info->record = NULL;
    info->data = NULL;
    info->is_watched = false;

    if (entity & ECS_ROLE) {
        return false;
    }
    
    ecs_record_t *record = ecs_eis_get(world, entity);

    if (!record) {
        return false;
    }

    set_info_from_record(entity, info, record);

    return true;
}